

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate2.hpp
# Opt level: O0

void __thiscall
qclab::qgates::QRotationGate2<std::complex<float>_>::QRotationGate2
          (QRotationGate2<std::complex<float>_> *this,int qubit0,int qubit1,real_type cos,
          real_type sin,bool fixed)

{
  int local_3c;
  int local_38;
  int qubits [2];
  bool fixed_local;
  real_type sin_local;
  real_type cos_local;
  int qubit1_local;
  int qubit0_local;
  QRotationGate2<std::complex<float>_> *this_local;
  
  QGate2<std::complex<float>_>::QGate2(&this->super_QGate2<std::complex<float>_>);
  QAdjustable::QAdjustable(&this->super_QAdjustable,fixed);
  (this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00758b10;
  QRotation<float>::QRotation(&this->rotation_,cos,sin);
  local_3c = qubit0;
  local_38 = qubit1;
  (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject[6])
            (this,&local_3c);
  return;
}

Assistant:

QRotationGate2( const int qubit0 , const int qubit1 ,
                        const real_type cos , const real_type sin ,
                        const bool fixed = false )
        : rotation_( cos , sin )
        , QAdjustable( fixed )
        {
          const int qubits[] = { qubit0 , qubit1 } ;
          setQubits( &qubits[0] ) ;
        }